

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O1

void sptk::world::anon_unknown_5::GetMultiChannelF0
               (double *f0,int f0_length,int *boundary_list,int number_of_boundaries,
               double **multi_channel_f0)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (1 < number_of_boundaries) {
    uVar6 = 0;
    do {
      iVar1 = boundary_list[uVar6 * 2];
      lVar4 = (long)iVar1;
      if (0 < lVar4) {
        memset(multi_channel_f0[uVar6],0,lVar4 * 8);
      }
      iVar2 = boundary_list[uVar6 * 2 + 1];
      if (iVar1 <= iVar2) {
        pdVar3 = multi_channel_f0[uVar6];
        lVar5 = 0;
        do {
          pdVar3[lVar4 + lVar5] = f0[lVar4 + lVar5];
          lVar5 = lVar5 + 1;
        } while ((iVar2 - iVar1) + 1 != (int)lVar5);
      }
      if ((int)((long)iVar2 + 1) < f0_length) {
        memset(multi_channel_f0[uVar6] + (long)iVar2 + 1,0,
               (ulong)(uint)((f0_length + -2) - iVar2) * 8 + 8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)number_of_boundaries >> 1);
  }
  return;
}

Assistant:

static void GetMultiChannelF0(const double *f0, int f0_length,
    const int *boundary_list, int number_of_boundaries,
    double **multi_channel_f0) {
  for (int i = 0; i < number_of_boundaries / 2; ++i) {
    for (int j = 0; j < boundary_list[i * 2]; ++j)
      multi_channel_f0[i][j] = 0.0;
    for (int j = boundary_list[i * 2]; j <= boundary_list[i * 2 + 1]; ++j)
      multi_channel_f0[i][j] = f0[j];
    for (int j = boundary_list[i * 2 + 1] + 1; j < f0_length; ++j)
      multi_channel_f0[i][j] = 0.0;
  }
}